

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O1

int LowMC_test_vector_129_129_4_4(void)

{
  int iVar1;
  uint8_t ciphertext_expected [17];
  uint8_t plaintext [17];
  uint8_t key [17];
  uint8_t local_58 [32];
  uint8_t local_38 [32];
  uint8_t local_18 [24];
  
  local_18[0] = '0';
  local_18[1] = 0xf3;
  local_18[2] = '4';
  local_18[3] = 0x88;
  local_18[4] = 'S';
  local_18[5] = '-';
  local_18[6] = '~';
  local_18[7] = 0xb8;
  local_18[8] = 0xa5;
  local_18[9] = 0xf8;
  local_18[10] = 0xfb;
  local_18[0xb] = 'O';
  local_18[0xc] = '.';
  local_18[0xd] = 'c';
  local_18[0xe] = 0xba;
  local_18[0xf] = 'V';
  local_18[0x10] = 0;
  local_38[0] = 0xc2;
  local_38[1] = 'j';
  local_38[2] = ']';
  local_38[3] = 0xf9;
  local_38[4] = '\x06';
  local_38[5] = '\x15';
  local_38[6] = 0x8d;
  local_38[7] = 0xcb;
  local_38[8] = 'j';
  local_38[9] = 199;
  local_38[10] = 0x89;
  local_38[0xb] = '\x1d';
  local_38[0xc] = 0xa9;
  local_38[0xd] = 0xf4;
  local_38[0xe] = 0x9f;
  local_38[0xf] = 'x';
  local_38[0x10] = 0;
  local_58[0] = '\v';
  local_58[1] = 'C';
  local_58[2] = 0xb6;
  local_58[3] = '_';
  local_58[4] = '|';
  local_58[5] = 'S';
  local_58[6] = 'P';
  local_58[7] = '\x06';
  local_58[8] = 0xcf;
  local_58[9] = '\'';
  local_58[10] = 0xe8;
  local_58[0xb] = 'o';
  local_58[0xc] = 'U';
  local_58[0xd] = '\x1b';
  local_58[0xe] = 0xd0;
  local_58[0xf] = '\x15';
  local_58[0x10] = 0x80;
  iVar1 = lowmc_enc(&parameters_129_129_4,local_18,local_38,local_58);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_129_129_4_4(void) {
  const uint8_t key[17] = {
      0x30, 0xf3, 0x34, 0x88, 0x53, 0x2d, 0x7e, 0xb8, 0xa5,
      0xf8, 0xfb, 0x4f, 0x2e, 0x63, 0xba, 0x56, 0x0,
  };
  const uint8_t plaintext[17] = {
      0xc2, 0x6a, 0x5d, 0xf9, 0x6,  0x15, 0x8d, 0xcb, 0x6a,
      0xc7, 0x89, 0x1d, 0xa9, 0xf4, 0x9f, 0x78, 0x0,
  };
  const uint8_t ciphertext_expected[17] = {
      0xb,  0x43, 0xb6, 0x5f, 0x7c, 0x53, 0x50, 0x6,  0xcf,
      0x27, 0xe8, 0x6f, 0x55, 0x1b, 0xd0, 0x15, 0x80,
  };

  return lowmc_enc(&parameters_129_129_4, key, plaintext, ciphertext_expected);
}